

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catmullclark_patch.h
# Opt level: O2

void embree::GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>::fix_quad_ring_order
               (array_t<embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>,_16UL> *patches)

{
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *pCVar1;
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *pCVar2;
  CatmullClark1Ring patches3ring3;
  CatmullClark1Ring patches2ring3;
  CatmullClark1Ring patches2ring2;
  CatmullClark1Ring patches1ring1;
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> CStack_d80;
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> local_a40;
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> local_700;
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> local_3c0;
  
  pCVar1 = patches->items[1].ring.items + 1;
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::CatmullClark1RingT(&local_3c0,pCVar1);
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::operator=
            (pCVar1,(CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *)(patches->items + 1));
  pCVar1 = patches->items[1].ring.items + 3;
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::operator=
            ((CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *)(patches->items + 1),pCVar1);
  pCVar2 = patches->items[1].ring.items + 2;
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::operator=(pCVar1,pCVar2);
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::operator=(pCVar2,&local_3c0);
  pCVar1 = patches->items[2].ring.items + 2;
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::CatmullClark1RingT(&local_700,pCVar1);
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::operator=
            (pCVar1,(CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *)(patches->items + 2));
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::operator=
            ((CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *)(patches->items + 2),&local_700);
  pCVar1 = patches->items[2].ring.items + 3;
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::CatmullClark1RingT(&local_a40,pCVar1);
  pCVar2 = patches->items[2].ring.items + 1;
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::operator=(pCVar1,pCVar2);
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::operator=(pCVar2,&local_a40);
  pCVar1 = patches->items[3].ring.items + 3;
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::CatmullClark1RingT(&CStack_d80,pCVar1);
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::operator=
            (pCVar1,(CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *)(patches->items + 3));
  pCVar1 = patches->items[3].ring.items + 1;
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::operator=
            ((CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *)(patches->items + 3),pCVar1);
  pCVar2 = patches->items[3].ring.items + 2;
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::operator=(pCVar1,pCVar2);
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::operator=(pCVar2,&CStack_d80);
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::~CatmullClark1RingT(&CStack_d80);
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::~CatmullClark1RingT(&local_a40);
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::~CatmullClark1RingT(&local_700);
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::~CatmullClark1RingT(&local_3c0);
  return;
}

Assistant:

static void fix_quad_ring_order (array_t<CatmullClarkPatch,GeneralCatmullClarkPatchT::SIZE>& patches)
    {
      CatmullClark1Ring patches1ring1 = patches[1].ring[1];
      patches[1].ring[1] = patches[1].ring[0]; // FIXME: optimize these assignments
      patches[1].ring[0] = patches[1].ring[3];
      patches[1].ring[3] = patches[1].ring[2];
      patches[1].ring[2] = patches1ring1;
      
      CatmullClark1Ring patches2ring2 = patches[2].ring[2];
      patches[2].ring[2] = patches[2].ring[0];
      patches[2].ring[0] = patches2ring2;
      CatmullClark1Ring patches2ring3 = patches[2].ring[3];
      patches[2].ring[3] = patches[2].ring[1];
      patches[2].ring[1] = patches2ring3;
      
      CatmullClark1Ring patches3ring3 = patches[3].ring[3];
      patches[3].ring[3] = patches[3].ring[0];
      patches[3].ring[0] = patches[3].ring[1];
      patches[3].ring[1] = patches[3].ring[2];
      patches[3].ring[2] = patches3ring3;
    }